

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

void duckdb::MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan> *this;
  idx_t iVar1;
  ArenaAllocator *this_00;
  ulong uVar2;
  HeapEntry<duckdb::string_t> *__s;
  InvalidInputException *pIVar3;
  ulong uVar4;
  ulong uVar5;
  TYPE val_val;
  UnifiedVectorFormat n_format;
  UnifiedVectorFormat val_format;
  UnifiedVectorFormat state_format;
  EXTRA_STATE val_extra_state;
  anon_union_16_2_67f50693_for_value local_1a0;
  undefined1 local_190 [16];
  AggregateInputData *local_180;
  ulong local_178;
  UnifiedVectorFormat local_170;
  UnifiedVectorFormat local_128;
  UnifiedVectorFormat local_e0;
  EXTRA_STATE local_98;
  
  local_180 = aggr_input;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_128);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_170);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
  MinMaxFallbackValue::CreateExtraState(&local_98,inputs,count);
  MinMaxFallbackValue::PrepareData(inputs,count,&local_98,&local_128);
  Vector::ToUnifiedFormat(inputs + 1,count,&local_170);
  Vector::ToUnifiedFormat(state_vector,count,&local_e0);
  if (count != 0) {
    uVar5 = 0;
    local_178 = count;
    do {
      uVar4 = uVar5;
      if ((local_128.sel)->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)(local_128.sel)->sel_vector[uVar5];
      }
      if ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6]
           >> (uVar4 & 0x3f) & 1) != 0)) {
        uVar2 = uVar5;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar2 = (ulong)(local_e0.sel)->sel_vector[uVar5];
        }
        this = *(UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan> **)
                (local_e0.data + uVar2 * 8);
        if ((char)this[1].capacity == '\0') {
          uVar2 = uVar5;
          if ((local_170.sel)->sel_vector != (sel_t *)0x0) {
            uVar2 = (ulong)(local_170.sel)->sel_vector[uVar5];
          }
          if (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            if ((local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar2 >> 6] >> (uVar2 & 0x3f) & 1) == 0) {
              pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_1a0._0_8_ = local_190;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a0,"Invalid input for MIN/MAX: n value cannot be NULL",""
                        );
              InvalidInputException::InvalidInputException(pIVar3,(string *)&local_1a0.pointer);
              __cxa_throw(pIVar3,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
          }
          iVar1 = *(idx_t *)(local_170.data + uVar2 * 8);
          if ((long)iVar1 < 1) {
            pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_1a0._0_8_ = local_190;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a0,"Invalid input for MIN/MAX: n value must be > 0","");
            InvalidInputException::InvalidInputException(pIVar3,(string *)&local_1a0.pointer);
            __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          if (999999 < (long)iVar1) {
            pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_1a0._0_8_ = local_190;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a0,"Invalid input for MIN/MAX: n value must be < %d","");
            InvalidInputException::InvalidInputException<long>
                      (pIVar3,(string *)&local_1a0.pointer,1000000);
            __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          this_00 = local_180->allocator;
          this->capacity = iVar1;
          __s = (HeapEntry<duckdb::string_t> *)ArenaAllocator::AllocateAligned(this_00,iVar1 << 5);
          switchD_005700f1::default(__s,0,this->capacity << 5);
          this->heap = __s;
          this->size = 0;
          *(undefined1 *)&this[1].capacity = 1;
          count = local_178;
        }
        local_1a0._0_8_ = *(undefined8 *)(local_128.data + uVar4 * 0x10);
        local_1a0.pointer.ptr = (char *)*(undefined8 *)(local_128.data + uVar4 * 0x10 + 8);
        UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan>::Insert
                  (this,local_180->allocator,(string_t *)&local_1a0.pointer);
      }
      uVar5 = uVar5 + 1;
    } while (count != uVar5);
  }
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  if (local_e0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_170.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_128.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void MinMaxNUpdate(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count, Vector &state_vector,
                          idx_t count) {

	auto &val_vector = inputs[0];
	auto &n_vector = inputs[1];

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat n_format;
	UnifiedVectorFormat state_format;

	auto val_extra_state = STATE::VAL_TYPE::CreateExtraState(val_vector, count);

	STATE::VAL_TYPE::PrepareData(val_vector, count, val_extra_state, val_format);

	n_vector.ToUnifiedFormat(count, n_format);
	state_vector.ToUnifiedFormat(count, state_format);

	auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);

	for (idx_t i = 0; i < count; i++) {
		const auto val_idx = val_format.sel->get_index(i);
		if (!val_format.validity.RowIsValid(val_idx)) {
			continue;
		}
		const auto state_idx = state_format.sel->get_index(i);
		auto &state = *states[state_idx];

		// Initialize the heap if necessary and add the input to the heap
		if (!state.is_initialized) {
			static constexpr int64_t MAX_N = 1000000;
			const auto nidx = n_format.sel->get_index(i);
			if (!n_format.validity.RowIsValid(nidx)) {
				throw InvalidInputException("Invalid input for MIN/MAX: n value cannot be NULL");
			}
			const auto nval = UnifiedVectorFormat::GetData<int64_t>(n_format)[nidx];
			if (nval <= 0) {
				throw InvalidInputException("Invalid input for MIN/MAX: n value must be > 0");
			}
			if (nval >= MAX_N) {
				throw InvalidInputException("Invalid input for MIN/MAX: n value must be < %d", MAX_N);
			}
			state.Initialize(aggr_input.allocator, UnsafeNumericCast<idx_t>(nval));
		}

		// Now add the input to the heap
		auto val_val = STATE::VAL_TYPE::Create(val_format, val_idx);
		state.heap.Insert(aggr_input.allocator, val_val);
	}
}